

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack7(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x19;
    out_local[1] = *in_local >> 0x12 & 0x7f;
    out_local[2] = *in_local >> 0xb & 0x7f;
    out_local[3] = *in_local >> 4 & 0x7f;
    out_local[4] = (*in_local & 0xf) << 3;
    out_local[4] = in_local[1] >> 0x1d | out_local[4];
    out_local[5] = in_local[1] >> 0x16 & 0x7f;
    out_local[6] = in_local[1] >> 0xf & 0x7f;
    out_local[7] = in_local[1] >> 8 & 0x7f;
    out_local[8] = in_local[1] >> 1 & 0x7f;
    out_local[9] = (in_local[1] & 1) << 6;
    out_local[9] = in_local[2] >> 0x1a | out_local[9];
    out_local[10] = in_local[2] >> 0x13 & 0x7f;
    out_local[0xb] = in_local[2] >> 0xc & 0x7f;
    out_local[0xc] = in_local[2] >> 5 & 0x7f;
    out_local[0xd] = (in_local[2] & 0x1f) << 2;
    out_local[0xd] = in_local[3] >> 0x1e | out_local[0xd];
    out_local[0xe] = in_local[3] >> 0x17 & 0x7f;
    out_local[0xf] = in_local[3] >> 0x10 & 0x7f;
    out_local[0x10] = in_local[3] >> 9 & 0x7f;
    out_local[0x11] = in_local[3] >> 2 & 0x7f;
    out_local[0x12] = (in_local[3] & 3) << 5;
    out_local[0x12] = in_local[4] >> 0x1b | out_local[0x12];
    out_local[0x13] = in_local[4] >> 0x14 & 0x7f;
    out_local[0x14] = in_local[4] >> 0xd & 0x7f;
    out_local[0x15] = in_local[4] >> 6 & 0x7f;
    out_local[0x16] = (in_local[4] & 0x3f) << 1;
    out_local[0x16] = in_local[5] >> 0x1f | out_local[0x16];
    out_local[0x17] = in_local[5] >> 0x18 & 0x7f;
    out_local[0x18] = in_local[5] >> 0x11 & 0x7f;
    out_local[0x19] = in_local[5] >> 10 & 0x7f;
    out_local[0x1a] = in_local[5] >> 3 & 0x7f;
    out_local[0x1b] = (in_local[5] & 7) << 4;
    out_local[0x1b] = in_local[6] >> 0x1c | out_local[0x1b];
    out_local[0x1c] = in_local[6] >> 0x15 & 0x7f;
    out_local[0x1d] = in_local[6] >> 0xe & 0x7f;
    out_local[0x1e] = in_local[6] >> 7 & 0x7f;
    out_local[0x1f] = in_local[6] & 0x7f;
    out_local = out_local + 0x20;
    in_local = in_local + 7;
  }
  return;
}

Assistant:

void __vseblocks_unpack7(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 7, --bs) {
    out[0] = in[0] >> 25;
    out[1] = (in[0] >> 18) & 0x7f;
    out[2] = (in[0] >> 11) & 0x7f;
    out[3] = (in[0] >> 4) & 0x7f;
    out[4] = (in[0] << 3) & 0x7f;
    out[4] |= in[1] >> 29;
    out[5] = (in[1] >> 22) & 0x7f;
    out[6] = (in[1] >> 15) & 0x7f;
    out[7] = (in[1] >> 8) & 0x7f;
    out[8] = (in[1] >> 1) & 0x7f;
    out[9] = (in[1] << 6) & 0x7f;
    out[9] |= in[2] >> 26;
    out[10] = (in[2] >> 19) & 0x7f;
    out[11] = (in[2] >> 12) & 0x7f;
    out[12] = (in[2] >> 5) & 0x7f;
    out[13] = (in[2] << 2) & 0x7f;
    out[13] |= in[3] >> 30;
    out[14] = (in[3] >> 23) & 0x7f;
    out[15] = (in[3] >> 16) & 0x7f;
    out[16] = (in[3] >> 9) & 0x7f;
    out[17] = (in[3] >> 2) & 0x7f;
    out[18] = (in[3] << 5) & 0x7f;
    out[18] |= in[4] >> 27;
    out[19] = (in[4] >> 20) & 0x7f;
    out[20] = (in[4] >> 13) & 0x7f;
    out[21] = (in[4] >> 6) & 0x7f;
    out[22] = (in[4] << 1) & 0x7f;
    out[22] |= in[5] >> 31;
    out[23] = (in[5] >> 24) & 0x7f;
    out[24] = (in[5] >> 17) & 0x7f;
    out[25] = (in[5] >> 10) & 0x7f;
    out[26] = (in[5] >> 3) & 0x7f;
    out[27] = (in[5] << 4) & 0x7f;
    out[27] |= in[6] >> 28;
    out[28] = (in[6] >> 21) & 0x7f;
    out[29] = (in[6] >> 14) & 0x7f;
    out[30] = (in[6] >> 7) & 0x7f;
    out[31] = in[6] & 0x7f;
  }
}